

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

void __thiscall pg::Game::unsafe_permute(Game *this,int *mapping)

{
  int iVar1;
  int *piVar2;
  uint64_t *puVar3;
  string **ppsVar4;
  string *psVar5;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  unsigned_long i;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  
  lVar7 = this->n_vertices;
  if (0 < lVar7) {
    piVar2 = this->strategy;
    lVar9 = 0;
    do {
      lVar12 = (long)piVar2[lVar9];
      if (lVar12 != -1) {
        piVar2[lVar9] = mapping[lVar12];
      }
      lVar9 = lVar9 + 1;
    } while (lVar7 != lVar9);
  }
  lVar7 = lVar7 + this->n_edges;
  if (lVar7 != 0) {
    piVar2 = this->_outedges;
    lVar9 = 0;
    do {
      lVar12 = (long)piVar2[lVar9];
      if (lVar12 != -1) {
        piVar2[lVar9] = mapping[lVar12];
      }
      lVar9 = lVar9 + 1;
    } while (lVar7 != lVar9);
  }
  piVar2 = this->_inedges;
  if (lVar7 != 0 && piVar2 != (int *)0x0) {
    lVar9 = 0;
    do {
      if ((long)piVar2[lVar9] != -1) {
        piVar2[lVar9] = mapping[piVar2[lVar9]];
      }
      lVar9 = lVar9 + 1;
    } while (lVar7 != lVar9);
  }
  if (0 < this->n_vertices) {
    uVar8 = 0;
    do {
      uVar15 = (ulong)(uint)mapping[uVar8];
      if (uVar8 != uVar15) {
        uVar10 = uVar8 >> 6;
        uVar13 = 1L << (uVar8 & 0x3f);
        bVar6 = (byte)uVar8 & 0x3f;
        uVar14 = -2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6;
        do {
          uVar16 = (ulong)(int)uVar15;
          mapping[uVar8] = mapping[uVar16];
          mapping[uVar16] = (int)uVar15;
          piVar2 = this->_priority;
          iVar1 = piVar2[uVar8];
          piVar2[uVar8] = piVar2[uVar16];
          piVar2[uVar16] = iVar1;
          puVar3 = (this->_owner)._bits;
          uVar17 = uVar16 >> 6;
          uVar15 = puVar3[uVar17];
          uVar18 = uVar15 & ~(1L << (uVar16 & 0x3f));
          if ((puVar3[uVar10] & uVar13) != 0) {
            uVar18 = uVar15 | 1L << (uVar16 & 0x3f);
          }
          puVar3[uVar17] = uVar18;
          uVar18 = puVar3[uVar10] | uVar13;
          if ((uVar15 >> (uVar16 & 0x3f) & 1) == 0) {
            uVar18 = puVar3[uVar10] & uVar14;
          }
          puVar3[uVar10] = uVar18;
          ppsVar4 = this->_label;
          psVar5 = ppsVar4[uVar8];
          ppsVar4[uVar8] = ppsVar4[uVar16];
          ppsVar4[uVar16] = psVar5;
          piVar2 = this->_firstouts;
          iVar1 = piVar2[uVar8];
          piVar2[uVar8] = piVar2[uVar16];
          piVar2[uVar16] = iVar1;
          piVar2 = this->_outcount;
          iVar1 = piVar2[uVar8];
          piVar2[uVar8] = piVar2[uVar16];
          piVar2[uVar16] = iVar1;
          if (this->_inedges != (int *)0x0) {
            piVar2 = this->_firstins;
            iVar1 = piVar2[uVar8];
            piVar2[uVar8] = piVar2[uVar16];
            piVar2[uVar16] = iVar1;
            piVar2 = this->_incount;
            iVar1 = piVar2[uVar8];
            piVar2[uVar8] = piVar2[uVar16];
            piVar2[uVar16] = iVar1;
          }
          uVar11 = 1L << (uVar16 & 0x3f);
          puVar3 = (this->solved)._bits;
          uVar15 = puVar3[uVar17];
          uVar18 = ~uVar11 & uVar15;
          if ((puVar3[uVar10] & uVar13) != 0) {
            uVar18 = uVar15 | uVar11;
          }
          puVar3[uVar17] = uVar18;
          uVar18 = puVar3[uVar10] | uVar13;
          if ((uVar15 & uVar11) == 0) {
            uVar18 = puVar3[uVar10] & uVar14;
          }
          puVar3[uVar10] = uVar18;
          puVar3 = (this->winner)._bits;
          uVar15 = puVar3[uVar17];
          uVar18 = ~uVar11 & uVar15;
          if ((puVar3[uVar10] & uVar13) != 0) {
            uVar18 = uVar15 | uVar11;
          }
          puVar3[uVar17] = uVar18;
          uVar18 = puVar3[uVar10] | uVar13;
          if ((uVar15 & uVar11) == 0) {
            uVar18 = puVar3[uVar10] & uVar14;
          }
          puVar3[uVar10] = uVar18;
          piVar2 = this->strategy;
          iVar1 = piVar2[uVar8];
          piVar2[uVar8] = piVar2[uVar16];
          piVar2[uVar16] = iVar1;
          uVar15 = (ulong)(uint)mapping[uVar8];
        } while (uVar8 != uVar15);
      }
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < this->n_vertices);
  }
  return;
}

Assistant:

void
Game::unsafe_permute(int *mapping)
{
    // first update vectors and arrays and the strategies
    for (int i=0; i<n_vertices; i++) {
        if (strategy[i] != -1) strategy[i] = mapping[strategy[i]];
    }
    unsigned long len = n_vertices + n_edges;
    for (unsigned long i=0; i<len; i++) {
        if (_outedges[i] != -1) _outedges[i] = mapping[_outedges[i]];
    }
    if (_inedges != NULL) {
        for (unsigned long i=0; i<len; i++) {
            if (_inedges[i] != -1) _inedges[i] = mapping[_inedges[i]];
        }
    }
    // swap nodes until done
    for (int i=0; i<n_vertices; i++) {
        // this is basically a loop, that swaps mapping[i] and i, until mapping[i] equals i.
        while (mapping[i] != i) {
            int k = mapping[i];
            mapping[i] = mapping[k];
            mapping[k] = k;
            // swap i and k
            std::swap(_priority[i], _priority[k]);
            { bool b = _owner[k]; _owner[k] = _owner[i]; _owner[i] = b; }
            std::swap(_label[i], _label[k]);
            // swap out array
            std::swap(_firstouts[i], _firstouts[k]);
            std::swap(_outcount[i], _outcount[k]);
            // swap in array
            if (_inedges != NULL) {
                std::swap(_firstins[i], _firstins[k]);
                std::swap(_incount[i], _incount[k]);
            }
            // swap solution
            { bool b = solved[k]; solved[k] = solved[i]; solved[i] = b; }
            { bool b = winner[k]; winner[k] = winner[i]; winner[i] = b; }
            std::swap(strategy[i], strategy[k]);
        }
    }
}